

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O0

void __thiscall
QSharedPointer<ssl_conf_ctx_st>::internalConstruct<ssl_conf_ctx_st,void(*)(ssl_conf_ctx_st*)>
          (QSharedPointer<ssl_conf_ctx_st> *this,ssl_conf_ctx_st *ptr,
          _func_void_ssl_conf_ctx_st_ptr *deleter)

{
  Self *pSVar1;
  _func_void_ssl_conf_ctx_st_ptr *in_RDX;
  ssl_conf_ctx_st *in_RSI;
  QSharedPointer<ssl_conf_ctx_st> *in_RDI;
  DestroyerFn actualDeleter;
  
  pSVar1 = QtSharedPointer::
           ExternalRefCountWithCustomDeleter<ssl_conf_ctx_st,_void_(*)(ssl_conf_ctx_st_*)>::create
                     (in_RSI,in_RDX,
                      QtSharedPointer::
                      ExternalRefCountWithCustomDeleter<ssl_conf_ctx_st,_void_(*)(ssl_conf_ctx_st_*)>
                      ::deleter);
  in_RDI->d = &pSVar1->super_ExternalRefCountData;
  enableSharedFromThis(in_RDI,in_RSI);
  return;
}

Assistant:

inline void internalConstruct(X *ptr, Deleter deleter)
    {
        typedef QtSharedPointer::ExternalRefCountWithCustomDeleter<X, Deleter> Private;
# ifdef QT_SHAREDPOINTER_TRACK_POINTERS
        typename Private::DestroyerFn actualDeleter = &Private::safetyCheckDeleter;
# else
        typename Private::DestroyerFn actualDeleter = &Private::deleter;
# endif
        d = Private::create(ptr, deleter, actualDeleter);

#ifdef QT_SHAREDPOINTER_TRACK_POINTERS
        internalSafetyCheckAdd(d, ptr);
#endif
        enableSharedFromThis(ptr);
    }